

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.hpp
# Opt level: O0

string * glcts::PipelineStatisticsQueryUtilities::getVerifyResultValuesErrorString<int>
                   (string *__return_storage_ptr__,int value,char *value_type,uint n_expected_values
                   ,GLuint64 *expected_values,GLenum query_type,string *draw_call_type_name,
                   string *primitive_type_name,bool is_primitive_restart_enabled)

{
  ostream *poVar1;
  char *pcVar2;
  GLenum value_00;
  string local_1f0;
  uint local_1d0;
  uint i;
  stringstream local_1c0 [8];
  stringstream log_sstream;
  ostream local_1b0;
  byte local_35;
  GLenum local_34;
  bool is_primitive_restart_enabled_local;
  GLuint64 *pGStack_30;
  GLenum query_type_local;
  GLuint64 *expected_values_local;
  char *pcStack_20;
  uint n_expected_values_local;
  char *value_type_local;
  string *psStack_10;
  int value_local;
  
  local_35 = is_primitive_restart_enabled;
  local_34 = query_type;
  pGStack_30 = expected_values;
  expected_values_local._4_4_ = n_expected_values;
  pcStack_20 = value_type;
  value_type_local._4_4_ = value;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1c0);
  poVar1 = std::operator<<(&local_1b0,"Invalid default ");
  poVar1 = std::operator<<(poVar1,pcStack_20);
  poVar1 = std::operator<<(poVar1," query result value: found [");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,value_type_local._4_4_);
  poVar1 = std::operator<<(poVar1,"], expected:[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*pGStack_30);
  std::operator<<(poVar1,"]");
  for (local_1d0 = 1; local_1d0 < expected_values_local._4_4_; local_1d0 = local_1d0 + 1) {
    poVar1 = std::operator<<(&local_1b0," or [");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,pGStack_30[local_1d0]);
    std::operator<<(poVar1,"]");
  }
  poVar1 = std::operator<<(&local_1b0,", query type:[");
  getStringForEnum_abi_cxx11_
            (&local_1f0,(PipelineStatisticsQueryUtilities *)(ulong)local_34,value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,"], GL_PRIMITIVE_RESTART mode:[");
  pcVar2 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if ((local_35 & 1) != 0) {
    pcVar2 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  poVar1 = std::operator<<(poVar1,pcVar2 + 0x27);
  poVar1 = std::operator<<(poVar1,"], draw call type:[");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,"], primitive type:[");
  pcVar2 = (char *)std::__cxx11::string::c_str();
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"].");
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

static std::string getVerifyResultValuesErrorString(VALUE_TYPE value, const char* value_type,
														unsigned int		 n_expected_values,
														const glw::GLuint64* expected_values, glw::GLenum query_type,
														std::string draw_call_type_name,
														std::string primitive_type_name,
														bool		is_primitive_restart_enabled)
	{
		std::stringstream log_sstream;

		DE_ASSERT(expected_values != DE_NULL);

		log_sstream << "Invalid default " << value_type << " query result value: found "
														   "["
					<< value << "], expected:"
								"["
					<< expected_values[0] << "]";

		for (unsigned int i = 1; i < n_expected_values; ++i)
		{
			log_sstream << " or [" << expected_values[i] << "]";
		}

		log_sstream << ", query type:"
					   "["
					<< getStringForEnum(query_type) << "], "
													   "GL_PRIMITIVE_RESTART mode:"
													   "["
					<< ((is_primitive_restart_enabled) ? "enabled" : "disabled") << "]"
																					", draw call type:"
																					"["
					<< draw_call_type_name.c_str() << "]"
													  ", primitive type:"
													  "["
					<< primitive_type_name.c_str() << "].";

		return log_sstream.str();
	}